

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint res;
  ulong uVar2;
  char cVar3;
  char *pcVar4;
  pair<const_char_*,_int> pVar5;
  
  res = (uint)(byte)*ptr;
  if (*ptr < '\0') {
    pVar5 = ReadSizeFallback(ptr,res);
    pcVar4 = pVar5.first;
    res = pVar5.second;
  }
  else {
    pcVar4 = ptr + 1;
  }
  if (pcVar4 == (char *)0x0) {
    return (char *)0x0;
  }
  if (this->unknown_ == (string *)0x0) {
    pcVar4 = EpsCopyInputStream::Skip(&ctx->super_EpsCopyInputStream,pcVar4,res);
    return pcVar4;
  }
  uVar2 = (ulong)(num * 8 + 2);
  cVar3 = (char)this->unknown_;
  if (0x7f < num << 3) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar2 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  uVar2 = (ulong)(int)res;
  cVar3 = (char)this->unknown_;
  if (0x7f < res) {
    do {
      std::__cxx11::string::push_back(cVar3);
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar2 >> 7;
    } while (bVar1);
  }
  std::__cxx11::string::push_back(cVar3);
  pcVar4 = EpsCopyInputStream::AppendString
                     (&ctx->super_EpsCopyInputStream,pcVar4,res,this->unknown_);
  return pcVar4;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }